

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.hpp
# Opt level: O0

void __thiscall MIDIplay::MIDIchannel::reset(MIDIchannel *this)

{
  MIDIchannel *this_local;
  
  resetAllControllers(this);
  this->patch = '\0';
  this->vibpos = 0.0;
  this->bank_lsb = '\0';
  this->bank_msb = '\0';
  this->lastlrpn = '\0';
  this->lastmrpn = '\0';
  this->nrpn = false;
  this->is_xg_percussion = false;
  return;
}

Assistant:

void reset()
        {
            resetAllControllers();
            patch = 0;
            vibpos = 0;
            bank_lsb = 0;
            bank_msb = 0;
            lastlrpn = 0;
            lastmrpn = 0;
            nrpn = false;
            is_xg_percussion = false;
        }